

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SyntaxNode *args_2;
  BinaryBinsSelectExprSyntax *pBVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryBinsSelectExprSyntax,slang::syntax::BinsSelectExpressionSyntax&,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(BinsSelectExpressionSyntax *)args,&local_30,
                      (BinsSelectExpressionSyntax *)args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryBinsSelectExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryBinsSelectExprSyntax>(
        *deepClone<BinsSelectExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<BinsSelectExpressionSyntax>(*node.right, alloc)
    );
}